

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SwapFieldsImpl<false>
          (Reflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  ReflectionSchema *this_00;
  _Rb_tree_color _Var1;
  MessageFactory *pMVar2;
  pointer ppFVar3;
  FieldDescriptor *field;
  long lVar4;
  _Base_ptr p_Var5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  LogMessage *pLVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  OneofDescriptor *oneof_descriptor;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  pointer ppFVar13;
  bool bVar14;
  int oneof_index;
  set<int,_std::less<int>,_std::allocator<int>_> swapped_oneof;
  int local_84;
  Message *local_80;
  Reflection *local_78;
  MessageLite *local_70;
  undefined1 local_68 [16];
  _Base_ptr local_58;
  _Alloc_hider local_50;
  _Base_ptr local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (message1 != message2) {
    local_80 = message2;
    (*(message1->super_MessageLite)._vptr_MessageLite[0x11])(message1);
    if (extraout_RDX != this) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x3d1);
      pLVar9 = internal::LogMessage::operator<<
                         ((LogMessage *)local_68,
                          "CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar9 = internal::LogMessage::operator<<(pLVar9,"First argument to SwapFields() (of type \"")
      ;
      iVar6 = (*(message1->super_MessageLite)._vptr_MessageLite[0x11])(message1);
      pLVar9 = internal::LogMessage::operator<<
                         (pLVar9,(string *)(*(long *)(CONCAT44(extraout_var,iVar6) + 8) + 0x20));
      pLVar9 = internal::LogMessage::operator<<
                         (pLVar9,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar9 = internal::LogMessage::operator<<
                         (pLVar9,(string *)(*(long *)(this->descriptor_ + 8) + 0x20));
      pLVar9 = internal::LogMessage::operator<<
                         (pLVar9,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_84,pLVar9);
      internal::LogMessage::~LogMessage((LogMessage *)local_68);
    }
    (*(local_80->super_MessageLite)._vptr_MessageLite[0x11])();
    if (extraout_RDX_00 != this) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x3d9);
      pLVar9 = internal::LogMessage::operator<<
                         ((LogMessage *)local_68,
                          "CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar9 = internal::LogMessage::operator<<
                         (pLVar9,"Second argument to SwapFields() (of type \"");
      iVar6 = (*(local_80->super_MessageLite)._vptr_MessageLite[0x11])();
      pLVar9 = internal::LogMessage::operator<<
                         (pLVar9,(string *)(*(long *)(CONCAT44(extraout_var_00,iVar6) + 8) + 0x20));
      pLVar9 = internal::LogMessage::operator<<
                         (pLVar9,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar9 = internal::LogMessage::operator<<
                         (pLVar9,(string *)(*(long *)(this->descriptor_ + 8) + 0x20));
      pLVar9 = internal::LogMessage::operator<<
                         (pLVar9,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_84,pLVar9);
      internal::LogMessage::~LogMessage((LogMessage *)local_68);
    }
    local_50._M_p = local_68 + 8;
    local_68._8_4_ = _S_red;
    local_58 = (_Base_ptr)0x0;
    local_40._M_allocated_capacity = 0;
    pMVar2 = this->message_factory_;
    local_78 = this;
    local_48 = (_Base_ptr)local_50._M_p;
    iVar6 = (*(message1->super_MessageLite)._vptr_MessageLite[0x11])(message1);
    iVar6 = (*pMVar2->_vptr_MessageFactory[2])(pMVar2,CONCAT44(extraout_var_01,iVar6));
    local_70 = (MessageLite *)CONCAT44(extraout_var_02,iVar6);
    ppFVar13 = (fields->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppFVar3 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar13 != ppFVar3) {
      this_00 = &local_78->schema_;
      do {
        field = *ppFVar13;
        if (((byte)field[1] & 8) == 0) {
          lVar4 = *(long *)(field + 0x28);
          if ((lVar4 == 0 || ((byte)field[1] & 0x10) == 0) ||
             ((*(int *)(lVar4 + 4) == 1 && ((*(byte *)(*(long *)(lVar4 + 0x20) + 1) & 2) != 0)))) {
            SwapField(local_78,message1,local_80,field);
            if ((~(byte)field[1] & 0x60) != 0) {
              SwapBit(local_78,message1,local_80,field);
            }
          }
          else {
            iVar6 = (int)((ulong)(lVar4 - *(long *)(*(long *)(lVar4 + 0x10) + 0x30)) >> 3);
            local_84 = iVar6 * -0x33333333;
            if (local_58 != (_Base_ptr)0x0) {
              p_Var5 = local_58;
              p_Var12 = (_Base_ptr)(local_68 + 8);
              do {
                p_Var11 = p_Var12;
                p_Var10 = p_Var5;
                _Var1 = p_Var10[1]._M_color;
                bVar14 = (int)(_Var1 + iVar6 * 0x33333333) < 0;
                p_Var12 = p_Var10;
                if (SBORROW4(_Var1,local_84) != bVar14) {
                  p_Var12 = p_Var11;
                }
                p_Var5 = (&p_Var10->_M_left)[SBORROW4(_Var1,local_84) != bVar14];
              } while ((&p_Var10->_M_left)[SBORROW4(_Var1,local_84) != bVar14] != (_Base_ptr)0x0);
              if (p_Var12 != (_Base_ptr)(local_68 + 8)) {
                if (SBORROW4(_Var1,local_84) != (int)(_Var1 + iVar6 * 0x33333333) < 0) {
                  p_Var10 = p_Var11;
                }
                if ((int)p_Var10[1]._M_color <= local_84) goto LAB_0039933d;
              }
            }
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       local_68,&local_84);
            if (((byte)field[1] & 0x10) == 0) {
              oneof_descriptor = (OneofDescriptor *)0x0;
            }
            else {
              oneof_descriptor = *(OneofDescriptor **)(field + 0x28);
            }
            SwapOneofField<false>(local_78,message1,local_80,oneof_descriptor);
          }
        }
        else {
          uVar7 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
          uVar8 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
          internal::ExtensionSet::SwapExtension
                    ((ExtensionSet *)
                     ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar7),
                     local_70,(ExtensionSet *)
                              ((long)&(local_80->super_MessageLite)._vptr_MessageLite + (ulong)uVar8
                              ),*(int *)(field + 4));
        }
LAB_0039933d:
        ppFVar13 = ppFVar13 + 1;
      } while (ppFVar13 != ppFVar3);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_68);
  }
  return;
}

Assistant:

void Reflection::SwapFieldsImpl(
    Message* message1, Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to SwapFields() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to SwapFields() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  std::set<int> swapped_oneof;

  GOOGLE_DCHECK(!unsafe_shallow_swap || message1->GetArenaForAllocation() ==
                                     message2->GetArenaForAllocation());

  const Message* prototype =
      message_factory_->GetPrototype(message1->GetDescriptor());
  for (const auto* field : fields) {
    CheckInvalidAccess(schema_, field);
    if (field->is_extension()) {
      if (unsafe_shallow_swap) {
        MutableExtensionSet(message1)->UnsafeShallowSwapExtension(
            MutableExtensionSet(message2), field->number());
      } else {
        MutableExtensionSet(message1)->SwapExtension(
            prototype, MutableExtensionSet(message2), field->number());
      }
    } else {
      if (schema_.InRealOneof(field)) {
        int oneof_index = field->containing_oneof()->index();
        // Only swap the oneof field once.
        if (swapped_oneof.find(oneof_index) != swapped_oneof.end()) {
          continue;
        }
        swapped_oneof.insert(oneof_index);
        SwapOneofField<unsafe_shallow_swap>(message1, message2,
                                            field->containing_oneof());
      } else {
        // Swap field.
        if (unsafe_shallow_swap) {
          UnsafeShallowSwapField(message1, message2, field);
        } else {
          SwapField(message1, message2, field);
        }
        // Swap has bit for non-repeated fields.  We have already checked for
        // oneof already. This has to be done after SwapField, because SwapField
        // may depend on the information in has bits.
        if (!field->is_repeated()) {
          SwapBit(message1, message2, field);
        }
      }
    }
  }
}